

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::GenKeyFieldMethods(RustGenerator *this,FieldDef *field)

{
  CodeWriter *this_00;
  char *__s;
  allocator<char> local_1ba;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (field->key != false) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"KEY_TYPE",&local_1ba);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"",&local_1b9);
    GenTableAccessorFuncReturnType(&local_198,this,field,&local_178);
    this_00 = &this->code_;
    CodeWriter::SetValue(this_00,&local_1b8,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b8,"REF",(allocator<char> *)&local_178);
    __s = "&";
    if ((field->value).type.base_type == BASE_TYPE_STRING) {
      __s = "";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,__s,&local_1ba);
    CodeWriter::SetValue(this_00,&local_1b8,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"#[inline]",(allocator<char> *)&local_1b8);
    CodeWriter::operator+=(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "pub fn key_compare_less_than(&self, o: &{{STRUCT_TY}}) -> bool {",
               (allocator<char> *)&local_1b8);
    CodeWriter::operator+=(this_00,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"  self.{{FIELD}}() < o.{{FIELD}}()",
               (allocator<char> *)&local_1b8);
    CodeWriter::operator+=(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"}",(allocator<char> *)&local_1b8);
    CodeWriter::operator+=(this_00,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"",(allocator<char> *)&local_1b8);
    CodeWriter::operator+=(this_00,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"#[inline]",(allocator<char> *)&local_1b8);
    CodeWriter::operator+=(this_00,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,
               "pub fn key_compare_with_value(&self, val: {{KEY_TYPE}}) -> ::core::cmp::Ordering {",
               (allocator<char> *)&local_1b8);
    CodeWriter::operator+=(this_00,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"  let key = self.{{FIELD}}();",(allocator<char> *)&local_1b8);
    CodeWriter::operator+=(this_00,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,"  key.cmp({{REF}}val)",(allocator<char> *)&local_1b8);
    CodeWriter::operator+=(this_00,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"}",(allocator<char> *)&local_1b8);
    CodeWriter::operator+=(this_00,&local_158);
    std::__cxx11::string::~string((string *)&local_158);
    return;
  }
  __assert_fail("field.key",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x96a,"void flatbuffers::rust::RustGenerator::GenKeyFieldMethods(const FieldDef &)"
               );
}

Assistant:

void GenKeyFieldMethods(const FieldDef &field) {
    FLATBUFFERS_ASSERT(field.key);

    code_.SetValue("KEY_TYPE", GenTableAccessorFuncReturnType(field, ""));
    code_.SetValue("REF", IsString(field.value.type) ? "" : "&");

    code_ += "#[inline]";
    code_ +=
        "pub fn key_compare_less_than(&self, o: &{{STRUCT_TY}}) -> "
        "bool {";
    code_ += "  self.{{FIELD}}() < o.{{FIELD}}()";
    code_ += "}";
    code_ += "";
    code_ += "#[inline]";
    code_ +=
        "pub fn key_compare_with_value(&self, val: {{KEY_TYPE}}) -> "
        "::core::cmp::Ordering {";
    code_ += "  let key = self.{{FIELD}}();";
    code_ += "  key.cmp({{REF}}val)";
    code_ += "}";
  }